

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

CRef __thiscall Glucose::Solver::propagate(Solver *this)

{
  ulong *puVar1;
  uint uVar2;
  lbool *plVar3;
  uint *puVar4;
  bool bVar5;
  Watcher WVar6;
  Solver *pSVar7;
  Watcher *pWVar8;
  vec<Glucose::Solver::Watcher> *pvVar9;
  Watcher WVar10;
  long lVar11;
  VarData VVar12;
  byte bVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  CRef unaff_EBP;
  uint uVar17;
  int iVar18;
  CRef CVar19;
  ulong uVar20;
  uint uVar21;
  VarData VVar22;
  byte bVar23;
  ulong uVar24;
  ulong uVar25;
  Watcher *pWVar26;
  Watcher *pWVar27;
  Watcher *pWVar28;
  byte bVar29;
  Watcher *pWVar30;
  bool bVar31;
  Watcher w;
  uint local_84;
  Watcher local_80;
  CRef local_74;
  ulong local_70;
  uint local_68;
  int local_64;
  ulong local_60;
  long local_58;
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>
  *local_50;
  Solver *local_48;
  vec<Glucose::Solver::Watcher> *local_40;
  Watcher *local_38;
  
  local_50 = &this->watches;
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(local_50);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(&this->watchesBin);
  OccLists<Glucose::Lit,_Glucose::vec<Glucose::Solver::Watcher>,_Glucose::Solver::WatcherDeleted>::
  cleanAll(&this->unaryWatches);
  local_84 = 0xffffffff;
  uVar25 = 0;
  local_48 = this;
  local_74 = unaff_EBP;
  do {
    iVar18 = this->qhead;
    if ((this->trail).sz <= iVar18) {
      this->propagations = this->propagations + uVar25;
      this->simpDB_props = this->simpDB_props - uVar25;
      return local_84;
    }
    this->qhead = iVar18 + 1;
    pvVar9 = (this->watchesBin).occs.data;
    uVar17 = (this->trail).data[iVar18].x;
    local_58 = (long)(int)uVar17;
    local_40 = (this->watches).occs.data + local_58;
    iVar18 = pvVar9[local_58].sz;
    bVar5 = 0 < iVar18;
    if (0 < iVar18) {
      pvVar9 = pvVar9 + local_58;
      lVar11 = 0;
      do {
        pWVar27 = pvVar9->data;
        iVar18 = pWVar27[lVar11].blocker.x;
        iVar14 = iVar18 >> 1;
        plVar3 = (this->assigns).data;
        bVar29 = plVar3[iVar14].value;
        bVar23 = (byte)iVar18 & 1;
        bVar13 = bVar29 ^ bVar23;
        if (bVar13 == 1) {
          local_74 = pWVar27[lVar11].cref;
        }
        else if ((bVar29 & 2) != 0) {
          CVar19 = pWVar27[lVar11].cref;
          plVar3[iVar14].value = bVar23;
          VVar22.level = (this->trail_lim).sz;
          VVar22.reason = CVar19;
          (this->vardata).data[iVar14] = VVar22;
          iVar14 = (this->trail).sz;
          (this->trail).sz = iVar14 + 1;
          (this->trail).data[iVar14].x = iVar18;
        }
        if (bVar13 == 1) break;
        lVar11 = lVar11 + 1;
        lVar15 = (long)pvVar9->sz;
        bVar5 = lVar11 < lVar15;
      } while (lVar11 < lVar15);
    }
    CVar19 = local_74;
    if (!bVar5) {
      pWVar27 = local_40->data;
      pWVar28 = pWVar27;
      local_60 = uVar25;
      if ((long)local_40->sz != 0) {
        pWVar30 = pWVar27 + local_40->sz;
        uVar17 = uVar17 ^ 1;
        pWVar26 = pWVar27;
        local_68 = uVar17;
        local_38 = pWVar30;
        do {
          pWVar8 = local_38;
          pSVar7 = local_48;
          uVar21 = local_68;
          iVar18 = (pWVar26->blocker).x;
          plVar3 = (this->assigns).data;
          if (plVar3[iVar18 >> 1].value == ((byte)iVar18 & 1)) {
            WVar10 = *pWVar26;
LAB_0010bcf0:
            pWVar27 = pWVar26 + 1;
            *pWVar28 = WVar10;
            pWVar28 = pWVar28 + 1;
          }
          else {
            uVar2 = pWVar26->cref;
            uVar25 = (ulong)uVar2;
            puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            puVar1 = (ulong *)(puVar4 + uVar25);
            if (*(uint *)((long)puVar1 + 0xc) == uVar17) {
              *(int *)((long)puVar1 + 0xc) = (int)puVar1[2];
              *(uint *)(puVar1 + 2) = uVar17;
            }
            pWVar27 = pWVar26 + 1;
            local_80.blocker.x = *(int *)((long)puVar1 + 0xc);
            local_80.cref = uVar2;
            if ((local_80.blocker.x != iVar18) &&
               (plVar3[local_80.blocker.x >> 1].value == ((byte)local_80.blocker.x & 1))) {
              WVar10.blocker.x = local_80.blocker.x;
              WVar10.cref = uVar2;
              goto LAB_0010bcf0;
            }
            uVar16 = *puVar1 >> 0x20;
            iVar18 = (int)(*puVar1 >> 0x20);
            bVar31 = 2 < iVar18;
            local_64 = local_80.blocker.x;
            if (this->incremental == 0) {
              if (2 < iVar18) {
                uVar21 = *(uint *)((long)puVar1 + 0x14);
                uVar24 = 2;
                if (((byte)uVar21 & 1 ^ plVar3[(int)uVar21 >> 1].value) == 1) {
                  lVar11 = 0;
                  do {
                    lVar15 = lVar11;
                    if (uVar16 - 3 == lVar15) goto LAB_0010beef;
                    uVar21 = puVar4[uVar25 + lVar15 + 6];
                    lVar11 = lVar15 + 1;
                  } while (((byte)uVar21 & 1 ^ plVar3[(int)uVar21 >> 1].value) == 1);
                  uVar24 = lVar15 + 3;
                  bVar31 = uVar24 < uVar16;
                }
                local_70 = CONCAT71(local_70._1_7_,bVar31);
                *(uint *)(puVar1 + 2) = uVar21;
                *(uint *)((long)puVar1 + uVar24 * 4 + 0xc) = uVar17;
                vec<Glucose::Solver::Watcher>::push
                          ((local_50->occs).data + ((long)(int)puVar1[2] ^ 1),&local_80);
                if ((char)local_70 != '\0') goto LAB_0010bcf7;
              }
LAB_0010beef:
              WVar6.blocker.x = local_80.blocker.x;
              WVar6.cref = local_80.cref;
              *pWVar28 = WVar6;
              pWVar28 = pWVar28 + 1;
              iVar18 = local_64 >> 1;
              plVar3 = (this->assigns).data;
              bVar29 = (byte)local_64 & 1;
              if ((plVar3[iVar18].value ^ bVar29) == 1) {
                this->qhead = (this->trail).sz;
                for (; local_84 = uVar2, pWVar27 < pWVar30; pWVar27 = pWVar27 + 1) {
                  *pWVar28 = *pWVar27;
                  pWVar28 = pWVar28 + 1;
                }
              }
              else {
                plVar3[iVar18].value = bVar29;
                VVar12.level = (this->trail_lim).sz;
                VVar12.reason = uVar2;
                (this->vardata).data[iVar18] = VVar12;
                iVar18 = (this->trail).sz;
                (this->trail).sz = iVar18 + 1;
                (this->trail).data[iVar18].x = local_64;
              }
            }
            else {
              uVar24 = 0xffffffff;
              iVar14 = -1;
              if (2 < iVar18) {
                uVar20 = 2;
                do {
                  iVar18 = (int)puVar4[uVar25 + uVar20 + 3] >> 1;
                  bVar29 = (byte)puVar4[uVar25 + uVar20 + 3] & 1;
                  if ((bVar29 ^ plVar3[iVar18].value) != 1) {
                    if ((((local_48->assumptions).sz < (local_48->trail_lim).sz) ||
                        (plVar3[iVar18].value == bVar29)) ||
                       (iVar18 <= local_48->nbVarsInitialFormula)) {
                      iVar14 = (int)uVar20;
                      break;
                    }
                    uVar24 = uVar20 & 0xffffffff;
                  }
                  iVar14 = (int)uVar24;
                  uVar20 = uVar20 + 1;
                } while (uVar16 != uVar20);
              }
              this = local_48;
              pWVar30 = local_38;
              uVar17 = local_68;
              local_70 = uVar25;
              if (iVar14 == -1) goto LAB_0010beef;
              *(undefined4 *)(puVar1 + 2) = *(undefined4 *)((long)puVar1 + (long)iVar14 * 4 + 0xc);
              *(uint *)((long)puVar1 + (long)iVar14 * 4 + 0xc) = local_68;
              vec<Glucose::Solver::Watcher>::push
                        ((local_50->occs).data + ((long)(int)puVar1[2] ^ 1),&local_80);
              this = pSVar7;
              pWVar30 = pWVar8;
              uVar17 = uVar21;
            }
          }
LAB_0010bcf7:
          pWVar26 = pWVar27;
        } while (pWVar27 != pWVar30);
      }
      uVar25 = local_60;
      CVar19 = local_74;
      iVar18 = (int)((ulong)((long)pWVar27 - (long)pWVar28) >> 3);
      if (0 < iVar18) {
        local_40->sz = local_40->sz - iVar18;
      }
      if ((this->useUnaryWatched == true) && (local_84 == 0xffffffff)) {
        local_84 = propagateUnaryWatches(this,(Lit)(int)local_58);
      }
    }
    uVar25 = (ulong)((int)uVar25 + 1);
    local_74 = CVar19;
    if (bVar5) {
      return CVar19;
    }
  } while( true );
}

Assistant:

CRef Solver::propagate() {
    CRef confl = CRef_Undef;
    int num_props = 0;
    watches.cleanAll();
    watchesBin.cleanAll();
    unaryWatches.cleanAll();
    while(qhead < trail.size()) {
        Lit p = trail[qhead++]; // 'p' is enqueued fact to propagate.
        vec <Watcher> &ws = watches[p];
        Watcher *i, *j, *end;
        num_props++;


        // First, Propagate binary clauses
        vec <Watcher> &wbin = watchesBin[p];
        for(int k = 0; k < wbin.size(); k++) {

            Lit imp = wbin[k].blocker;

            if(value(imp) == l_False) {
                return wbin[k].cref;
            }

            if(value(imp) == l_Undef) {
                uncheckedEnqueue(imp, wbin[k].cref);
            }
        }

        // Now propagate other 2-watched clauses
        for(i = j = (Watcher *) ws, end = i + ws.size(); i != end;) {
            // Try to avoid inspecting the clause:
            Lit blocker = i->blocker;
            if(value(blocker) == l_True) {
                *j++ = *i++;
                continue;
            }

            // Make sure the false literal is data[1]:
            CRef cr = i->cref;
            Clause &c = ca[cr];
            assert(!c.getOneWatched());
            Lit false_lit = ~p;
            if(c[0] == false_lit)
                c[0] = c[1], c[1] = false_lit;
            assert(c[1] == false_lit);
            i++;

            // If 0th watch is true, then clause is already satisfied.
            Lit first = c[0];
            Watcher w = Watcher(cr, first);
            if(first != blocker && value(first) == l_True) {

                *j++ = w;
                continue;
            }
#ifdef INCREMENTAL
            if(incremental) { // ----------------- INCREMENTAL MODE
              int choosenPos = -1;
              for (int k = 2; k < c.size(); k++) {

            if (value(c[k]) != l_False){
              if(decisionLevel()>assumptions.size()) {
                choosenPos = k;
                break;
              } else {
                choosenPos = k;

                if(value(c[k])==l_True || !isSelector(var(c[k]))) {
                  break;
                }
              }

            }
              }
              if(choosenPos!=-1) {
            c[1] = c[choosenPos]; c[choosenPos] = false_lit;
            watches[~c[1]].push(w);
            goto NextClause; }
            } else {  // ----------------- DEFAULT  MODE (NOT INCREMENTAL)
#endif
            for(int k = 2; k < c.size(); k++) {

                if(value(c[k]) != l_False) {
                    c[1] = c[k];
                    c[k] = false_lit;
                    watches[~c[1]].push(w);
                    goto NextClause;
                }
            }
#ifdef INCREMENTAL
            }
#endif
            // Did not find watch -- clause is unit under assignment:
            *j++ = w;
            if(value(first) == l_False) {
                confl = cr;
                qhead = trail.size();
                // Copy the remaining watches:
                while(i < end)
                    *j++ = *i++;
            } else {
                uncheckedEnqueue(first, cr);


            }
            NextClause:;
        }
        ws.shrink(i - j);

        // unaryWatches "propagation"
        if(useUnaryWatched && confl == CRef_Undef) {
            confl = propagateUnaryWatches(p);

        }

    }


    propagations += num_props;
    simpDB_props -= num_props;

    return confl;
}